

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<QWidget_const*,QStyleSheetStyleCaches::Tampered<QFont>>::
emplace_helper<QStyleSheetStyleCaches::Tampered<QFont>>
          (QHash<QWidget_const*,QStyleSheetStyleCaches::Tampered<QFont>> *this,QWidget **key,
          Tampered<QFont> *args)

{
  piter pVar1;
  Node<QWidget_const*,QStyleSheetStyleCaches::Tampered<QFont>> *this_00;
  long in_FS_OFFSET;
  undefined1 local_48 [32];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<QWidget_const*,QStyleSheetStyleCaches::Tampered<QFont>>>::
  findOrInsert<QWidget_const*>
            ((InsertionResult *)local_48,
             *(Data<QHashPrivate::Node<QWidget_const*,QStyleSheetStyleCaches::Tampered<QFont>>> **)
              this,key);
  this_00 = (Node<QWidget_const*,QStyleSheetStyleCaches::Tampered<QFont>> *)
            ((*(Span **)(local_48._0_8_ + 0x20))[(ulong)local_48._8_8_ >> 7].entries +
            (*(Span **)(local_48._0_8_ + 0x20))[(ulong)local_48._8_8_ >> 7].offsets
            [(uint)local_48._8_8_ & 0x7f]);
  if (local_48[0x10] == false) {
    *(QWidget **)this_00 = *key;
    QFont::QFont((QFont *)(this_00 + 8),&args->oldWidgetValue);
    *(uint *)(this_00 + 0x18) = args->resolveMask;
  }
  else {
    QHashPrivate::Node<QWidget_const*,QStyleSheetStyleCaches::Tampered<QFont>>::
    emplaceValue<QStyleSheetStyleCaches::Tampered<QFont>>(this_00,args);
  }
  pVar1.bucket = local_48._8_8_;
  pVar1.d = (Data<QHashPrivate::Node<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_>_> *)
            local_48._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (iterator)pVar1;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }